

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QLocale __thiscall QVariant::toLocale(QVariant *this)

{
  qvariant_cast<QLocale>(this);
  return (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)this;
}

Assistant:

QLocale QVariant::toLocale() const
{
    return qvariant_cast<QLocale>(*this);
}